

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExportRef
BinaryenAddTableExport(BinaryenModuleRef module,char *internalName,char *externalName)

{
  Export *this;
  Name local_58;
  Name local_48 [2];
  Export *local_28;
  Export *ret;
  char *externalName_local;
  char *internalName_local;
  BinaryenModuleRef module_local;
  
  ret = (Export *)externalName;
  externalName_local = internalName;
  internalName_local = (char *)module;
  this = (Export *)operator_new(0x28);
  (this->value).super_IString.str._M_len = 0;
  (this->value).super_IString.str._M_str = (char *)0x0;
  (this->name).super_IString.str._M_len = 0;
  (this->name).super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&this->kind = 0;
  wasm::Export::Export(this);
  local_28 = this;
  wasm::Name::Name(local_48,externalName_local);
  wasm::Name::operator=(&local_28->value,local_48);
  wasm::Name::Name(&local_58,(char *)ret);
  wasm::Name::operator=(&local_28->name,&local_58);
  local_28->kind = Table;
  wasm::Module::addExport((Module *)internalName_local,local_28);
  return local_28;
}

Assistant:

BinaryenExportRef BinaryenAddTableExport(BinaryenModuleRef module,
                                         const char* internalName,
                                         const char* externalName) {
  auto* ret = new Export();
  ret->value = internalName;
  ret->name = externalName;
  ret->kind = ExternalKind::Table;
  ((Module*)module)->addExport(ret);
  return ret;
}